

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::SkipElement(ColladaParser *this,char *pElement)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string element;
  char *pElement_local;
  ColladaParser *this_local;
  
  element.field_2._8_8_ = pElement;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pElement,&local_39);
  std::allocator<char>::~allocator(&local_39);
  do {
    do {
      uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((uVar2 & 1) == 0) goto LAB_00678f85;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    bVar1 = std::operator==((char *)CONCAT44(extraout_var,iVar3),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38);
  } while (!bVar1);
LAB_00678f85:
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ColladaParser::SkipElement(const char* pElement) {
    // copy the current node's name because it'a pointer to the reader's internal buffer,
    // which is going to change with the upcoming parsing
    std::string element = pElement;
    while (mReader->read()) {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (mReader->getNodeName() == element) {
                break;
            }
        }
    }
}